

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

void fct_logger_print_failures(fct_nlist_t *fail_list)

{
  size_t sVar1;
  ulong uVar2;
  
  puts("\n----------------------------------------------------------------------------\n");
  puts("FAILED TESTS\n\n");
  if ((fail_list != (fct_nlist_t *)0x0) && (sVar1 = fail_list->used_itm_num, sVar1 != 0)) {
    uVar2 = 0;
    do {
      if (fail_list->used_itm_num <= uVar2) {
        __assert_fail("idx < list->used_itm_num",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x322,"void *fct_nlist__at(const fct_nlist_t *, size_t)");
      }
      puts((char *)fail_list->itm_list[uVar2]);
      uVar2 = uVar2 + 1;
    } while (sVar1 != uVar2);
  }
  puts("\n");
  return;
}

Assistant:

static void
fct_logger_print_failures(fct_nlist_t const *fail_list)
{
    puts(
        "\n----------------------------------------------------------------------------\n"
    );
    puts("FAILED TESTS\n\n");
    FCT_NLIST_FOREACH_BGN(char *, cndtn_str, fail_list)
    {
        printf("%s\n", cndtn_str);
    }
    FCT_NLIST_FOREACH_END();

    puts("\n");
}